

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall Person::Person(Person *this,string *name,string *id,Address *address)

{
  Address *address_local;
  string *id_local;
  string *name_local;
  Person *this_local;
  
  this->_vptr_Person = (_func_int **)&PTR_validate_0014aa40;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->id);
  Address::Address(&this->address,address);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->id,(string *)id);
  return;
}

Assistant:

Person::Person(const string &name, const string &id, const Address &address) : address(address) {

//    if (!validate(id))
//    {
//        cout << "invalid id";
//        exit(1);
//    }
       this->name = name;
       this->id = id;
}